

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O1

void __thiscall QXcbForeignWindow::~QXcbForeignWindow(QXcbForeignWindow *this)

{
  QXcbSyncWindowRequest **this_00;
  
  this_00 = &this[-1].super_QXcbWindow.m_pendingSyncRequest;
  ~QXcbForeignWindow((QXcbForeignWindow *)this_00);
  operator_delete(this_00,0x100);
  return;
}

Assistant:

QXcbForeignWindow::~QXcbForeignWindow()
{
    if (QPlatformWindow::parent())
        setParent(nullptr);

    // Clear window so that destroy() does not affect it
    m_window = 0;

    if (connection()->mouseGrabber() == this)
        connection()->setMouseGrabber(nullptr);
    if (connection()->mousePressWindow() == this)
        connection()->setMousePressWindow(nullptr);
}